

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O0

void test_AString_replaceRange_success_indexInBoundsRangeBeyondSize_fn(int _i)

{
  AString string_00;
  bool bVar1;
  int iVar2;
  char *in_stack_fffffffffffffeb0;
  uintmax_t _ck_y_7;
  uintmax_t _ck_x_9;
  uintmax_t _ck_y_6;
  uintmax_t _ck_x_8;
  char *_ck_y_q_1;
  char *_ck_x_q_1;
  char *_ck_y_s_1;
  char *_ck_x_s_1;
  char *_ck_y_5;
  char *_ck_x_7;
  void *_ck_x_6;
  uintmax_t _ck_y_4;
  uintmax_t _ck_x_5;
  uintmax_t _ck_y_3;
  uintmax_t _ck_x_4;
  uintmax_t _ck_y_2;
  uintmax_t _ck_x_3;
  char *_ck_y_q;
  char *_ck_x_q;
  char *_ck_y_s;
  char *_ck_x_s;
  char *_ck_y_1;
  char *_ck_x_2;
  void *_ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  AString string;
  int _i_local;
  
  string.buffer._4_4_ = _i;
  private_ACUtilsTest_AString_constructTestString((AString *)&_ck_x,"01234x",8);
  private_ACUtilsTest_AString_setReallocFail(false,0);
  bVar1 = AString_replaceRange((AString *)&_ck_x,5,0x29a,'y',2);
  if (bVar1 == false) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x570,"Assertion \'AString_replaceRange(&string, 5, 666, \'y\', 2)\' failed",
                      0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x570);
  if (string.size != 8) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x571,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                      "(string).capacity",string.size,"(8)",8,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x571);
  if (string.capacity == 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x571,"Assertion \'_ck_x != NULL\' failed",
                      "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                      "(void*) (string).buffer",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x571);
  _ck_y_s = (char *)string.capacity;
  if (string.capacity == 0) {
    _ck_y_q = "";
    _ck_y_s = "(null)";
  }
  else {
    _ck_y_q = "\"";
    iVar2 = strcmp("01234yy",(char *)string.capacity);
    if (iVar2 == 0) {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x571);
      if (string.deallocator != (ACUtilsDeallocator)0x7) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x571,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "(string).size == strlen(\"01234yy\")","(string).size",string.deallocator,
                          "strlen(\"01234yy\")",7,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x571);
      if (private_ACUtilsTest_AString_reallocCount != 0) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x572,"Assertion \'_ck_x == _ck_y\' failed",
                          "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                          "private_ACUtilsTest_AString_reallocCount == (0)",
                          "private_ACUtilsTest_AString_reallocCount",
                          private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x572);
      bVar1 = AString_replaceRange((AString *)&_ck_x,6,0x2a,'z',2);
      if (bVar1 == false) {
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x573,
                          "Assertion \'AString_replaceRange(&string, 6, 42, \'z\', 2)\' failed",0);
      }
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x573);
      if (string.size == 8) {
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x574);
        if (string.capacity == 0) {
          _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                            ,0x574,"Assertion \'_ck_x != NULL\' failed",
                            "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                            "(void*) (string).buffer",0,0);
        }
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x574);
        _ck_y_s_1 = (char *)string.capacity;
        if (string.capacity == 0) {
          _ck_y_q_1 = "";
          _ck_y_s_1 = "(null)";
        }
        else {
          _ck_y_q_1 = "\"";
          iVar2 = strcmp("01234yzz",(char *)string.capacity);
          if (iVar2 == 0) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x574);
            if (string.deallocator != (ACUtilsDeallocator)0x8) {
              _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x574,"Assertion \'_ck_x == _ck_y\' failed",
                                "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                                "(string).size == strlen(\"01234yzz\")","(string).size",
                                string.deallocator,"strlen(\"01234yzz\")",8,0);
            }
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x574);
            if (private_ACUtilsTest_AString_reallocCount == 0) {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x575);
              string_00.deallocator = string.deallocator;
              string_00.reallocator = string.reallocator;
              string_00.size = string.size;
              string_00.capacity = string.capacity;
              string_00.buffer = in_stack_fffffffffffffeb0;
              private_ACUtilsTest_AString_destructTestString(string_00);
              return;
            }
            _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x575,"Assertion \'_ck_x == _ck_y\' failed",
                              "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                              "private_ACUtilsTest_AString_reallocCount == (0)",
                              "private_ACUtilsTest_AString_reallocCount",
                              private_ACUtilsTest_AString_reallocCount,"(0)",0,0);
          }
        }
        _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x574,
                          "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                          ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                          "(string).buffer == (\"01234yzz\")","(string).buffer",_ck_y_q_1,_ck_y_s_1,
                          _ck_y_q_1,"(\"01234yzz\")","\"","01234yzz","\"",0);
      }
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x574,"Assertion \'_ck_x == _ck_y\' failed",
                        "Assertion \'%s\' failed: %s == %ju, %s == %ju","(string).capacity == (8)",
                        "(string).capacity",string.size,"(8)",8,0);
    }
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x571,
                    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                    ,"Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s",
                    "(string).buffer == (\"01234yy\")","(string).buffer",_ck_y_q,_ck_y_s,_ck_y_q,
                    "(\"01234yy\")","\"","01234yy","\"",0);
}

Assistant:

END_TEST
START_TEST(test_AString_replaceRange_success_indexInBoundsRangeBeyondSize)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("01234x", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_replaceRange(&string, 5, 666, 'y', 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234yy", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_replaceRange(&string, 6, 42, 'z', 2));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "01234yzz", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}